

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_zTXt(LodePNGInfo *info,LodePNGDecompressSettings *zlibsettings,uchar *data,
                   size_t chunkLength)

{
  LodePNGInfo *info_00;
  ulong in_RCX;
  long in_RDX;
  ucvector decoded;
  char *key;
  uint string2_begin;
  uint length;
  uint i;
  uint error;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 uVar1;
  uchar *in_stack_ffffffffffffffb0;
  uchar *in_stack_ffffffffffffffb8;
  size_t *in_stack_ffffffffffffffc0;
  uint local_2c;
  uint local_28;
  uint local_24;
  
  ucvector_init((ucvector *)&stack0xffffffffffffffb0);
  local_2c = 0;
  while( true ) {
    uVar1 = false;
    if (local_2c < in_RCX) {
      uVar1 = *(char *)(in_RDX + (ulong)local_2c) != '\0';
    }
    if ((bool)uVar1 == false) break;
    local_2c = local_2c + 1;
  }
  if (local_2c + 2 < in_RCX) {
    if ((local_2c == 0) || (0x4f < local_2c)) {
      local_24 = 0x59;
    }
    else {
      info_00 = (LodePNGInfo *)lodepng_malloc(0x127299);
      if (info_00 == (LodePNGInfo *)0x0) {
        local_24 = 0x53;
      }
      else {
        *(undefined1 *)((long)&info_00->compression_method + (ulong)local_2c) = 0;
        for (local_28 = 0; local_28 != local_2c; local_28 = local_28 + 1) {
          *(undefined1 *)((long)&info_00->compression_method + (ulong)local_28) =
               *(undefined1 *)(in_RDX + (ulong)local_28);
        }
        if (*(char *)(in_RDX + (ulong)(local_2c + 1)) == '\0') {
          if (in_RCX < local_2c + 2) {
            local_24 = 0x4b;
          }
          else {
            local_24 = zlib_decompress((uchar **)info_00,in_stack_ffffffffffffffc0,
                                       in_stack_ffffffffffffffb8,(size_t)in_stack_ffffffffffffffb0,
                                       (LodePNGDecompressSettings *)
                                       CONCAT17(uVar1,in_stack_ffffffffffffffa8));
            if (local_24 == 0) {
              ucvector_push_back((ucvector *)CONCAT17(uVar1,in_stack_ffffffffffffffa8),'\0');
              local_24 = lodepng_add_text(info_00,(char *)in_stack_ffffffffffffffc0,
                                          (char *)in_stack_ffffffffffffffb8);
            }
          }
        }
        else {
          local_24 = 0x48;
        }
      }
    }
  }
  else {
    local_24 = 0x4b;
  }
  lodepng_free((void *)0x1273b0);
  ucvector_cleanup((void *)0x1273ba);
  return local_24;
}

Assistant:

static unsigned readChunk_zTXt(LodePNGInfo* info, const LodePNGDecompressSettings* zlibsettings,
	const unsigned char* data, size_t chunkLength)
{
	unsigned error = 0;
	unsigned i;

	unsigned length, string2_begin;
	char *key = 0;
	ucvector decoded;

	ucvector_init(&decoded);

	while (!error) /*not really a while loop, only used to break on error*/
	{
		for (length = 0; length < chunkLength && data[length] != 0; ++length);
		if (length + 2 >= chunkLength) CERROR_BREAK(error, 75); /*no null termination, corrupt?*/
		if (length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

		key = (char*)lodepng_malloc(length + 1);
		if (!key) CERROR_BREAK(error, 83); /*alloc fail*/

		key[length] = 0;
		for (i = 0; i != length; ++i) key[i] = (char)data[i];

		if (data[length + 1] != 0) CERROR_BREAK(error, 72); /*the 0 byte indicating compression must be 0*/

		string2_begin = length + 2;
		if (string2_begin > chunkLength) CERROR_BREAK(error, 75); /*no null termination, corrupt?*/

		length = chunkLength - string2_begin;
		/*will fail if zlib error, e.g. if length is too small*/
		error = zlib_decompress(&decoded.data, &decoded.size,
			(unsigned char*)(&data[string2_begin]),
			length, zlibsettings);
		if (error) break;
		ucvector_push_back(&decoded, 0);

		error = lodepng_add_text(info, key, (char*)decoded.data);

		break;
	}

	lodepng_free(key);
	ucvector_cleanup(&decoded);

	return error;
}